

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

void __thiscall Js::CompoundString::BlockInfo::CopyTo(BlockInfo *this,Block *block)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((block->bufferOwner).ptr + 1 != (Block *)(this->buffer).ptr) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1b0,"(block->Buffer() == buffer)","block->Buffer() == buffer");
    if (!bVar2) goto LAB_00b37ed3;
    *puVar3 = 0;
  }
  if (this->charLength < block->charLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1b1,"(block->CharLength() <= charLength)",
                                "block->CharLength() <= charLength");
    if (!bVar2) goto LAB_00b37ed3;
    *puVar3 = 0;
  }
  if (block->charCapacity != this->charCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x1b2,"(block->CharCapacity() == charCapacity)",
                                "block->CharCapacity() == charCapacity");
    if (!bVar2) {
LAB_00b37ed3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Block::SetCharLength(block,this->charLength);
  return;
}

Assistant:

void CompoundString::BlockInfo::CopyTo(Block *const block)
    {
        Assert(block->Buffer() == buffer);
        Assert(block->CharLength() <= charLength);
        Assert(block->CharCapacity() == charCapacity);

        block->SetCharLength(charLength);
    }